

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpConnection::handle_read
          (TcpConnection *this,error_code *error,size_t bytes_transferred)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  error_category *peVar4;
  pointer pcVar5;
  __int_type_conflict3 _Var6;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((this->triggerhalt)._M_base._M_i & 1U) != 0) {
    LOCK();
    (this->state)._M_i = HALTED;
    UNLOCK();
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
    return;
  }
  if (error->_M_value == 0) {
    std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<gmlc::networking::TcpConnection,void>
              (local_80,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                        this);
    uVar3 = std::
            function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
            ::operator()(&this->dataCall,(shared_ptr<gmlc::networking::TcpConnection> *)local_80,
                         (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                         bytes_transferred);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    if (uVar3 < (this->residBufferSize).super___atomic_base<unsigned_long>._M_i + bytes_transferred)
    {
      if (uVar3 != 0) {
        pcVar5 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar1 = pcVar5 + uVar3;
        pcVar5 = pcVar5 + (((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                           bytes_transferred) - (long)pcVar1);
        if (pcVar5 != (pointer)0x0) {
          memmove((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,pcVar1,(size_t)pcVar5);
        }
      }
      LOCK();
      (this->residBufferSize).super___atomic_base<unsigned_long>._M_i =
           (bytes_transferred - uVar3) +
           (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
    }
    else {
      LOCK();
      (this->residBufferSize).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      local_c0._M_dataplus._M_p._0_4_ = (uint)local_c0._M_dataplus._M_p & 0xffffff00;
      std::vector<char,_std::allocator<char>_>::_M_fill_assign
                (&this->data,
                 (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(value_type *)&local_c0);
    }
LAB_0036aa5d:
    LOCK();
    (this->state)._M_i = WAITING;
    UNLOCK();
    startReceive(this);
  }
  else {
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)&local_c0,operation_aborted);
    if ((error->_M_cat != (error_category *)local_c0._M_string_length) ||
       (error->_M_value != (uint)local_c0._M_dataplus._M_p)) {
      if (bytes_transferred != 0) {
        std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<gmlc::networking::TcpConnection,void>
                  (local_90,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             *)this);
        uVar3 = std::
                function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                ::operator()(&this->dataCall,(shared_ptr<gmlc::networking::TcpConnection> *)local_90
                             ,(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                             (this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                             bytes_transferred);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
        if (uVar3 < (this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                    bytes_transferred) {
          if (uVar3 != 0) {
            pcVar5 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar1 = pcVar5 + uVar3;
            pcVar5 = pcVar5 + (((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                               bytes_transferred) - (long)pcVar1);
            if (pcVar5 != (pointer)0x0) {
              memmove((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,pcVar1,(size_t)pcVar5);
            }
          }
          _Var6 = (bytes_transferred - uVar3) +
                  (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
        }
        else {
          _Var6 = 0;
        }
        LOCK();
        (this->residBufferSize).super___atomic_base<unsigned_long>._M_i = _Var6;
        UNLOCK();
      }
      if ((this->errorCall).super__Function_base._M_manager == (_Manager_type)0x0) {
        peVar4 = ::asio::error::get_misc_category();
        if ((error->_M_cat != peVar4) || (error->_M_value != 2)) {
          std::error_code::error_code<asio::error::basic_errors,void>
                    ((error_code *)&local_c0,connection_reset);
          if ((error->_M_cat != (error_category *)local_c0._M_string_length) ||
             (error->_M_value != (uint)local_c0._M_dataplus._M_p)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"receive error ",&local_c1);
            (**(code **)(*(long *)error->_M_cat + 0x20))(&local_70,error->_M_cat,error->_M_value);
            std::operator+(&local_c0,&local_50,&local_70);
            logger(this,0,(string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      else {
        std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<gmlc::networking::TcpConnection,void>
                  (local_a0,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             *)this);
        bVar2 = std::
                function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                ::operator()(&this->errorCall,
                             (shared_ptr<gmlc::networking::TcpConnection> *)local_a0,error);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
        if (bVar2) goto LAB_0036aa5d;
      }
    }
    LOCK();
    (this->state)._M_i = HALTED;
    UNLOCK();
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
  }
  return;
}

Assistant:

void TcpConnection::handle_read(
    const std::error_code& error,
    size_t bytes_transferred)
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    }
    if (!error) {
        auto used = dataCall(
            shared_from_this(),
            data.data(),
            bytes_transferred + residBufferSize);
        if (used < (bytes_transferred + residBufferSize)) {
            if (used > 0) {
                std::copy(
                    data.data() + used,
                    data.data() + bytes_transferred + residBufferSize,
                    data.data());
            }
            residBufferSize = bytes_transferred + residBufferSize - used;
        } else {
            residBufferSize = 0;
            data.assign(data.size(), 0);
        }
        state = ConnectionStates::WAITING;
        startReceive();
    } else if (error == asio::error::operation_aborted) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    } else {
        // there was an error
        if (bytes_transferred > 0) {
            auto used = dataCall(
                shared_from_this(),
                data.data(),
                bytes_transferred + residBufferSize);
            if (used < (bytes_transferred + residBufferSize)) {
                if (used > 0) {
                    std::copy(
                        data.data() + used,
                        data.data() + bytes_transferred + residBufferSize,
                        data.data());
                }
                residBufferSize = bytes_transferred + residBufferSize - used;
            } else {
                residBufferSize = 0;
            }
        }
        if (errorCall) {
            if (errorCall(shared_from_this(), error)) {
                state = ConnectionStates::WAITING;
                startReceive();
            } else {
                state = ConnectionStates::HALTED;
                receivingHalt.trigger();
            }
        } else if (error != asio::error::eof) {
            if (error != asio::error::connection_reset) {
                logger(0, std::string("receive error ") + error.message());
            }
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        } else {
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        }
    }
}